

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O3

void Qentem::Memory::Copy<unsigned_int>(void *to,void *from,uint size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  
  uVar3 = 0;
  if (0xf < size) {
    uVar3 = (ulong)(size & 0xfffffff0);
    puVar4 = (undefined8 *)from;
    puVar5 = (undefined8 *)to;
    do {
      uVar1 = *puVar4;
      uVar2 = puVar4[1];
      puVar4 = puVar4 + 2;
      *puVar5 = uVar1;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    } while (puVar4 < (undefined8 *)((long)from + uVar3));
  }
  if ((uint)uVar3 < size) {
    do {
      *(undefined1 *)((long)to + uVar3) = *(undefined1 *)((long)from + uVar3);
      uVar3 = uVar3 + 1;
    } while (size != uVar3);
  }
  return;
}

Assistant:

QENTEM_NOINLINE static void Copy(void *to, const void *from, Number_T size) noexcept {
    Number_T offset = 0;

    if (Config::IsSIMDEnabled) {
        const Number_T m_size = (size >> Platform::SIMD::Shift);

        if (m_size != 0) {
            offset = m_size;
            offset <<= Platform::SIMD::Shift;

            Platform::SIMD::VAR_T       *m_to   = (Platform::SIMD::VAR_T *)(to);
            const Platform::SIMD::VAR_T *m_form = (const Platform::SIMD::VAR_T *)(from);
            const Platform::SIMD::VAR_T *end    = (m_form + m_size);

            do {
                Platform::SIMD::Store(m_to, Platform::SIMD::Load(m_form));
                ++m_form;
                ++m_to;
            } while (m_form < end);
        }
    }

    char       *des = (char *)(to);
    const char *src = (const char *)(from);

    while (offset < size) {
        des[offset] = src[offset];
        ++offset;
    }
}